

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

bool duckdb::GreaterThan::Operation<double>(double *left,double *right)

{
  bool bVar1;
  
  bVar1 = GreaterThanFloat<double>(*left,*right);
  return bVar1;
}

Assistant:

bool GreaterThan::Operation(const double &left, const double &right) {
	return GreaterThanFloat<double>(left, right);
}